

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proj.c
# Opt level: O3

void project(OSQPWorkspace *work,c_float *z)

{
  OSQPData *pOVar1;
  long lVar2;
  c_float *pcVar3;
  c_float *pcVar4;
  long lVar5;
  double dVar6;
  
  pOVar1 = work->data;
  lVar2 = pOVar1->m;
  if (0 < lVar2) {
    pcVar3 = pOVar1->l;
    pcVar4 = pOVar1->u;
    lVar5 = 0;
    do {
      dVar6 = z[lVar5];
      if (z[lVar5] <= pcVar3[lVar5]) {
        dVar6 = pcVar3[lVar5];
      }
      if (pcVar4[lVar5] <= dVar6) {
        dVar6 = pcVar4[lVar5];
      }
      z[lVar5] = dVar6;
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
  }
  return;
}

Assistant:

void project(OSQPWorkspace *work, c_float *z) {
  c_int i, m;

  m = work->data->m;

  for (i = 0; i < m; i++) {
    z[i] = c_min(c_max(z[i],
                       work->data->l[i]), // Between lower
                 work->data->u[i]);       // and upper bounds
  }
}